

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::SyntaxAnalyze(SyntaxAnalyze *this)

{
  this->_initLayerNum = 0;
  this->matched_index = 0xffffffffffffffff;
  this->layer_num = 0;
  this->_genValueNum = 0;
  this->word_list = &tmp_vect_word;
  symbolTable::SymbolTable::SymbolTable(&this->symbolTable);
  irGenerator::irGenerator::irGenerator(&this->irGenerator);
  optimization::bmir_variable_table::BmirVariableTable::BmirVariableTable(&this->bmirVariableTable);
  return;
}

Assistant:

SyntaxAnalyze::SyntaxAnalyze() : matched_index(-1), word_list(tmp_vect_word) {}